

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_hv_accept.cpp
# Opt level: O0

int __thiscall
ir_emit_vertex::accept(ir_emit_vertex *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  undefined4 in_register_00000034;
  long *plVar1;
  int local_38;
  int local_34;
  ir_visitor_status s;
  ir_hierarchical_visitor *v_local;
  ir_emit_vertex *this_local;
  
  plVar1 = (long *)CONCAT44(in_register_00000034,__fd);
  local_34 = (**(code **)(*plVar1 + 0x120))();
  if (local_34 == 0) {
    local_38 = (*(this->stream->super_ir_instruction)._vptr_ir_instruction[3])(this->stream,plVar1);
    if (local_38 == 0) {
      this_local._4_4_ = (**(code **)(*plVar1 + 0x128))(plVar1,this);
    }
    else {
      if (local_38 == 1) {
        local_38 = 0;
      }
      this_local._4_4_ = local_38;
    }
  }
  else {
    if (local_34 == 1) {
      local_34 = 0;
    }
    this_local._4_4_ = local_34;
  }
  return this_local._4_4_;
}

Assistant:

ir_visitor_status
ir_emit_vertex::accept(ir_hierarchical_visitor *v)
{
   ir_visitor_status s = v->visit_enter(this);
   if (s != visit_continue)
      return (s == visit_continue_with_parent) ? visit_continue : s;

   s = this->stream->accept(v);
   if (s != visit_continue)
      return (s == visit_continue_with_parent) ? visit_continue : s;

   assert(s == visit_continue);
   return v->visit_leave(this);
}